

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O0

REF_STATUS ref_part_scalar_sol(REF_NODE ref_node,REF_INT *ldim,REF_DBL **scalar,char *filename)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  void *pvVar4;
  int local_544;
  int local_540;
  int local_538;
  REF_LONG ref_private_status_reis_bi_6;
  REF_LONG ref_private_status_reis_ai_6;
  REF_STATUS ref_private_macro_code_rxs_1;
  REF_STATUS ref_private_macro_code_rxs;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_LONG ref_private_status_reis_bi_5;
  REF_LONG ref_private_status_reis_ai_5;
  REF_INT ref_malloc_init_i;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_LONG ref_private_status_reis_bi_4;
  REF_LONG ref_private_status_reis_ai_4;
  REF_LONG ref_private_status_reis_bi_3;
  REF_LONG ref_private_status_reis_ai_3;
  REF_LONG ref_private_status_reis_bi_2;
  REF_LONG ref_private_status_reis_ai_2;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  char local_498 [4];
  REF_BOOL found_keyword;
  char line [1024];
  long lStack_88;
  REF_INT status;
  REF_LONG nnode_read;
  REF_LONG nnode;
  REF_INT i;
  REF_INT type;
  REF_INT ntype;
  REF_INT dim;
  REF_INT local;
  REF_INT node;
  REF_GLOB global;
  void *pvStack_50;
  REF_INT section_size;
  REF_DBL *data;
  FILE *pFStack_40;
  REF_INT chunk;
  FILE *file;
  REF_MPI ref_mpi;
  char *filename_local;
  REF_DBL **scalar_local;
  REF_INT *ldim_local;
  REF_NODE ref_node_local;
  
  file = (FILE *)ref_node->ref_mpi;
  nnode_read = -1;
  bVar1 = false;
  pFStack_40 = (FILE *)0x0;
  ref_mpi = (REF_MPI)filename;
  filename_local = (char *)scalar;
  scalar_local = (REF_DBL **)ldim;
  ldim_local = &ref_node->n;
  if (ref_node->ref_mpi->id == 0) {
    pFStack_40 = fopen(filename,"r");
    if (pFStack_40 == (FILE *)0x0) {
      printf("unable to open %s\n",ref_mpi);
    }
    if (pFStack_40 == (FILE *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0xb29,
             "ref_part_scalar_sol","unable to open file");
      return 2;
    }
    type = -1;
    do {
      iVar2 = feof(pFStack_40);
      if ((iVar2 != 0) || (iVar2 = __isoc99_fscanf(pFStack_40,"%s",local_498), iVar2 == -1))
      goto LAB_001ba84b;
      if ((long)iVar2 != 1) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0xb2f,"ref_part_scalar_sol","line read failed",1,(long)iVar2);
        return 1;
      }
      iVar2 = strcmp("Dimension",local_498);
      if (iVar2 == 0) {
        iVar2 = __isoc99_fscanf(pFStack_40,"%d",&type);
        if ((long)iVar2 != 1) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0xb32,"ref_part_scalar_sol","read dim",1,(long)iVar2);
          return 1;
        }
        printf("dim %d\n",(ulong)(uint)type);
      }
      iVar2 = strcmp("SolAtVertices",local_498);
    } while (iVar2 != 0);
    iVar2 = __isoc99_fscanf(pFStack_40,"%ld",&nnode_read);
    if ((long)iVar2 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0xb37,
             "ref_part_scalar_sol","read nnode",1,(long)iVar2);
      return 1;
    }
    printf("nnode %d\n",nnode_read & 0xffffffff);
    iVar2 = __isoc99_fscanf(pFStack_40,"%d",&i);
    if ((long)iVar2 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0xb39,
             "ref_part_scalar_sol","read ldim",1,(long)iVar2);
      return 1;
    }
    printf("ntype %d\n",(ulong)(uint)i);
    *(undefined4 *)scalar_local = 0;
    for (nnode._0_4_ = 0; (int)(uint)nnode < i; nnode._0_4_ = (uint)nnode + 1) {
      iVar2 = __isoc99_fscanf(pFStack_40,"%d",(long)&nnode + 4);
      if ((long)iVar2 != 1) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0xb3d,"ref_part_scalar_sol","read type",1,(long)iVar2);
        return 1;
      }
      printf("%d type %d\n",(ulong)(uint)nnode,(ulong)nnode._4_4_);
      if (nnode._4_4_ == 1) {
        *(int *)scalar_local = *(int *)scalar_local + 1;
      }
      else {
        if (nnode._4_4_ != 2) {
          printf("item %d type %d\n",(ulong)(uint)nnode,(ulong)nnode._4_4_);
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0xb45,"ref_part_scalar_sol","solb type");
          return 1;
        }
        *(REF_INT *)scalar_local = type + *(int *)scalar_local;
      }
    }
    iVar2 = __isoc99_fscanf(pFStack_40,"%*[^1234567890-+.]");
    if (iVar2 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0xb48,
             "ref_part_scalar_sol","skip blank line");
      return 1;
    }
    bVar1 = true;
LAB_001ba84b:
    if (type == -1) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0xb4d,
             "ref_part_scalar_sol","Dimension keyword missing from .sol metric");
      return 1;
    }
    if (!bVar1) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0xb4e,
             "ref_part_scalar_sol","SolAtVertices keyword missing from .sol metric");
      return 1;
    }
    printf("nnode %d ldim %d dim %d\n",nnode_read & 0xffffffff,(ulong)*(uint *)scalar_local,
           (ulong)(uint)type);
  }
  uVar3 = ref_mpi_bcast((REF_MPI)file,&nnode_read,1,2);
  if (uVar3 == 0) {
    uVar3 = ref_mpi_bcast((REF_MPI)file,scalar_local,1,1);
    if (uVar3 == 0) {
      uVar3 = ref_mpi_bcast((REF_MPI)file,&type,1,1);
      if (uVar3 == 0) {
        if ((nnode_read != *(long *)(ldim_local + 0x1a)) &&
           (nnode_read / 2 != *(long *)(ldim_local + 0x1a))) {
          if (*(int *)&file->field_0x4 == 0) {
            printf("file %ld ref_node %ld %s\n",nnode_read,*(undefined8 *)(ldim_local + 0x1a),
                   ref_mpi);
          }
          if (nnode_read <= *(long *)(ldim_local + 0x1a)) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0xb5e,"ref_part_scalar_sol","ERROR: global count mismatch, too few");
            return 1;
          }
          if (*(int *)&file->field_0x4 == 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0xb5c,"ref_part_scalar_sol","WARNING: global count mismatch, too many");
          }
        }
        if (*(int *)scalar_local * ldim_local[1] < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0xb62,"ref_part_scalar_sol","malloc *scalar of REF_DBL negative");
          ref_node_local._4_4_ = 1;
        }
        else {
          pvVar4 = malloc((long)(*(int *)scalar_local * ldim_local[1]) << 3);
          *(void **)filename_local = pvVar4;
          if (*(long *)filename_local == 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0xb62,"ref_part_scalar_sol","malloc *scalar of REF_DBL NULL");
            ref_node_local._4_4_ = 2;
          }
          else {
            if (nnode_read / (long)**(int **)(ldim_local + 0x14) < 100000) {
              local_538 = 100000;
            }
            else {
              local_538 = (int)(nnode_read / (long)**(int **)(ldim_local + 0x14));
            }
            if (local_538 < nnode_read) {
              local_540 = local_538;
            }
            else {
              local_540 = (int)nnode_read;
            }
            data._4_4_ = local_540;
            if (*(int *)scalar_local * local_540 < 0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0xb68,"ref_part_scalar_sol","malloc data of REF_DBL negative");
              ref_node_local._4_4_ = 1;
            }
            else {
              pvStack_50 = malloc((long)(*(int *)scalar_local * local_540) << 3);
              if (pvStack_50 == (void *)0x0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0xb68,"ref_part_scalar_sol","malloc data of REF_DBL NULL");
                ref_node_local._4_4_ = 2;
              }
              else {
                for (ref_private_status_reis_ai_5._0_4_ = 0;
                    (int)ref_private_status_reis_ai_5 < *(int *)scalar_local * data._4_4_;
                    ref_private_status_reis_ai_5._0_4_ = (int)ref_private_status_reis_ai_5 + 1) {
                  *(undefined8 *)((long)pvStack_50 + (long)(int)ref_private_status_reis_ai_5 * 8) =
                       0xbff0000000000000;
                }
                for (lStack_88 = 0; lStack_88 < nnode_read; lStack_88 = global._4_4_ + lStack_88) {
                  if (data._4_4_ < (int)nnode_read - (int)lStack_88) {
                    local_544 = data._4_4_;
                  }
                  else {
                    local_544 = (int)nnode_read - (int)lStack_88;
                  }
                  global._4_4_ = local_544;
                  if (*(int *)(*(long *)(ldim_local + 0x14) + 4) == 0) {
                    for (nnode._0_4_ = 0; (int)(uint)nnode < *(int *)scalar_local * global._4_4_;
                        nnode._0_4_ = (uint)nnode + 1) {
                      iVar2 = __isoc99_fscanf(pFStack_40,"%lf",
                                              (void *)((long)pvStack_50 + (long)(int)(uint)nnode * 8
                                                      ));
                      if ((long)iVar2 != 1) {
                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                               ,0xb6f,"ref_part_scalar_sol","vertex data read error",1,(long)iVar2);
                        return 1;
                      }
                    }
                    uVar3 = ref_mpi_bcast(*(REF_MPI *)(ldim_local + 0x14),pvStack_50,
                                          *(int *)scalar_local * data._4_4_,3);
                    if (uVar3 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0xb72,"ref_part_scalar_sol",(ulong)uVar3,"bcast");
                      return uVar3;
                    }
                  }
                  else {
                    uVar3 = ref_mpi_bcast(*(REF_MPI *)(ldim_local + 0x14),pvStack_50,
                                          *(int *)scalar_local * data._4_4_,3);
                    if (uVar3 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0xb76,"ref_part_scalar_sol",(ulong)uVar3,"bcast");
                      return uVar3;
                    }
                  }
                  for (dim = 0; dim < global._4_4_; dim = dim + 1) {
                    _local = dim + lStack_88;
                    uVar3 = ::ref_node_local((REF_NODE)ldim_local,_local,&ntype);
                    if ((uVar3 != 0) && (uVar3 != 5)) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0xb7a,"ref_part_scalar_sol",(ulong)uVar3,"local");
                      return uVar3;
                    }
                    if (ntype != -1) {
                      for (nnode._0_4_ = 0; (int)(uint)nnode < *(int *)scalar_local;
                          nnode._0_4_ = (uint)nnode + 1) {
                        *(undefined8 *)
                         (*(long *)filename_local +
                         (long)(int)((uint)nnode + ntype * *(int *)scalar_local) * 8) =
                             *(undefined8 *)
                              ((long)pvStack_50 +
                              (long)(int)((uint)nnode + dim * *(int *)scalar_local) * 8);
                      }
                    }
                    if (type == 2) {
                      _local = nnode_read + dim + lStack_88;
                      uVar3 = ::ref_node_local((REF_NODE)ldim_local,_local,&ntype);
                      if ((uVar3 != 0) && (uVar3 != 5)) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                               ,0xb82,"ref_part_scalar_sol",(ulong)uVar3,"local");
                        return uVar3;
                      }
                      if (ntype != -1) {
                        for (nnode._0_4_ = 0; (int)(uint)nnode < *(int *)scalar_local;
                            nnode._0_4_ = (uint)nnode + 1) {
                          *(undefined8 *)
                           (*(long *)filename_local +
                           (long)(int)((uint)nnode + ntype * *(int *)scalar_local) * 8) =
                               *(undefined8 *)
                                ((long)pvStack_50 +
                                (long)(int)((uint)nnode + dim * *(int *)scalar_local) * 8);
                        }
                      }
                    }
                  }
                }
                if (pvStack_50 != (void *)0x0) {
                  free(pvStack_50);
                }
                if (*(int *)(*(long *)(ldim_local + 0x14) + 4) == 0) {
                  iVar2 = fclose(pFStack_40);
                  if ((long)iVar2 != 0) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0xb90,"ref_part_scalar_sol","close file",0,(long)iVar2);
                    return 1;
                  }
                }
                ref_node_local._4_4_ = 0;
              }
            }
          }
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0xb53,"ref_part_scalar_sol",(ulong)uVar3,"bcast dim");
        ref_node_local._4_4_ = uVar3;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0xb52,
             "ref_part_scalar_sol",(ulong)uVar3,"bcast ldim");
      ref_node_local._4_4_ = uVar3;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0xb51,
           "ref_part_scalar_sol",(ulong)uVar3,"bcast nnode");
    ref_node_local._4_4_ = uVar3;
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_part_scalar_sol(REF_NODE ref_node, REF_INT *ldim,
                                              REF_DBL **scalar,
                                              const char *filename) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  FILE *file;
  REF_INT chunk;
  REF_DBL *data;
  REF_INT section_size;
  REF_GLOB global;
  REF_INT node, local;
  REF_INT dim, ntype, type, i;
  REF_LONG nnode = REF_EMPTY, nnode_read;
  REF_INT status;
  char line[1024];
  REF_BOOL found_keyword = REF_FALSE;

  file = NULL;
  if (ref_mpi_once(ref_node_mpi(ref_node))) {
    file = fopen(filename, "r");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");

    dim = REF_EMPTY;
    while (!feof(file)) {
      status = fscanf(file, "%s", line);
      if (EOF == status) break;
      REIS(1, status, "line read failed");

      if (0 == strcmp("Dimension", line)) {
        REIS(1, fscanf(file, "%d", &dim), "read dim");
        printf("dim %d\n", dim);
      }

      if (0 == strcmp("SolAtVertices", line)) {
        REIS(1, fscanf(file, "%ld", &nnode), "read nnode");
        printf("nnode %d\n", (REF_INT)nnode);
        REIS(1, fscanf(file, "%d", &ntype), "read ldim");
        printf("ntype %d\n", ntype);
        *ldim = 0;
        for (i = 0; i < ntype; i++) {
          REIS(1, fscanf(file, "%d", &type), "read type");
          printf("%d type %d\n", i, type);
          if (1 == type) {
            (*ldim) += 1;
          } else if (2 == type) {
            (*ldim) += dim;
          } else {
            printf("item %d type %d\n", i, type);
            THROW("solb type");
          }
        }
        RAS(0 <= fscanf(file, "%*[^1234567890-+.]"), "skip blank line");
        found_keyword = REF_TRUE;
        break;
      }
    }
    RUS(REF_EMPTY, dim, "Dimension keyword missing from .sol metric");
    RAS(found_keyword, "SolAtVertices keyword missing from .sol metric");
    printf("nnode %d ldim %d dim %d\n", (REF_INT)nnode, *ldim, dim);
  }
  RSS(ref_mpi_bcast(ref_mpi, &nnode, 1, REF_GLOB_TYPE), "bcast nnode");
  RSS(ref_mpi_bcast(ref_mpi, ldim, 1, REF_INT_TYPE), "bcast ldim");
  RSS(ref_mpi_bcast(ref_mpi, &dim, 1, REF_INT_TYPE), "bcast dim");

  if ((nnode != ref_node_n_global(ref_node)) &&
      (nnode / 2 != ref_node_n_global(ref_node))) {
    if (ref_mpi_once(ref_mpi))
      printf("file %ld ref_node " REF_GLOB_FMT " %s\n", nnode,
             ref_node_n_global(ref_node), filename);
    if (nnode > ref_node_n_global(ref_node)) {
      if (ref_mpi_once(ref_mpi))
        REF_WHERE("WARNING: global count mismatch, too many");
    } else {
      THROW("ERROR: global count mismatch, too few");
    }
  }

  ref_malloc(*scalar, (*ldim) * ref_node_max(ref_node), REF_DBL);

  chunk =
      (REF_INT)MAX(100000, nnode / (REF_LONG)ref_mpi_n(ref_node_mpi(ref_node)));
  chunk = (REF_INT)MIN((REF_LONG)chunk, nnode);

  ref_malloc_init(data, (*ldim) * chunk, REF_DBL, -1.0);

  nnode_read = 0;
  while (nnode_read < nnode) {
    section_size = MIN(chunk, (REF_INT)(nnode - nnode_read));
    if (ref_mpi_once(ref_node_mpi(ref_node))) {
      for (i = 0; i < ((*ldim) * section_size); i++)
        REIS(1, fscanf(file, "%lf", &(data[i])), "vertex data read error");
      RSS(ref_mpi_bcast(ref_node_mpi(ref_node), data, (*ldim) * chunk,
                        REF_DBL_TYPE),
          "bcast");
    } else {
      RSS(ref_mpi_bcast(ref_node_mpi(ref_node), data, (*ldim) * chunk,
                        REF_DBL_TYPE),
          "bcast");
    }
    for (node = 0; node < section_size; node++) {
      global = node + nnode_read;
      RXS(ref_node_local(ref_node, global, &local), REF_NOT_FOUND, "local");
      if (REF_EMPTY != local) {
        for (i = 0; i < *ldim; i++) {
          (*scalar)[i + local * (*ldim)] = data[i + node * (*ldim)];
        }
      }
      if (2 == dim) {
        global = nnode + (REF_GLOB)node + nnode_read;
        RXS(ref_node_local(ref_node, global, &local), REF_NOT_FOUND, "local");
        if (REF_EMPTY != local) {
          for (i = 0; i < *ldim; i++) {
            (*scalar)[i + local * (*ldim)] = data[i + node * (*ldim)];
          }
        }
      }
    }
    nnode_read += (REF_LONG)section_size;
  }

  ref_free(data);

  if (ref_mpi_once(ref_node_mpi(ref_node))) {
    REIS(0, fclose(file), "close file");
  }
  return REF_SUCCESS;
}